

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trade.cpp
# Opt level: O0

void Handlers::Trade_Close(Character *character,PacketReader *reader)

{
  int num;
  undefined1 local_48 [8];
  PacketBuilder builder;
  PacketReader *reader_local;
  Character *character_local;
  
  if ((character->trading & 1U) != 0) {
    builder.add_size = (size_t)reader;
    PacketReader::GetChar(reader);
    PacketBuilder::PacketBuilder((PacketBuilder *)local_48,PACKET_TRADE,PACKET_CLOSE,2);
    num = Character::PlayerID(character);
    PacketBuilder::AddShort((PacketBuilder *)local_48,num);
    Character::Send(character->trade_partner,(PacketBuilder *)local_48);
    character->trading = false;
    std::__cxx11::list<Character_Item,_std::allocator<Character_Item>_>::clear
              (&character->trade_inventory);
    character->trade_agree = false;
    character->trade_partner->trading = false;
    std::__cxx11::list<Character_Item,_std::allocator<Character_Item>_>::clear
              (&character->trade_partner->trade_inventory);
    character->trade_agree = false;
    Character::CheckQuestRules(character);
    Character::CheckQuestRules(character->trade_partner);
    character->trade_partner->trade_partner = (Character *)0x0;
    character->trade_partner = (Character *)0x0;
    PacketBuilder::~PacketBuilder((PacketBuilder *)local_48);
  }
  return;
}

Assistant:

void Trade_Close(Character *character, PacketReader &reader)
{
	if (!character->trading) return;

	/*int something =*/ reader.GetChar();

	PacketBuilder builder(PACKET_TRADE, PACKET_CLOSE, 2);

	builder.AddShort(character->PlayerID());
	character->trade_partner->Send(builder);

	character->trading = false;
	character->trade_inventory.clear();
	character->trade_agree = false;

	character->trade_partner->trading = false;
	character->trade_partner->trade_inventory.clear();
	character->trade_agree = false;

	character->CheckQuestRules();
	character->trade_partner->CheckQuestRules();

	character->trade_partner->trade_partner = 0;
	character->trade_partner = 0;
}